

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_korax.cpp
# Opt level: O0

int AF_A_KoraxCommand(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *ent;
  DObject *this;
  int iVar1;
  int iVar2;
  bool bVar3;
  bool local_8a;
  bool local_87;
  FName local_84;
  TAngle<double> local_80;
  undefined1 local_78 [8];
  DVector3 pos;
  FSoundID local_58;
  int local_54;
  int numcommands;
  DAngle ang;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                  ,0x10c,"int AF_A_KoraxCommand(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    ent = (AActor *)(param->field_0).field_1.a;
    local_87 = true;
    if (ent != (AActor *)0x0) {
      local_87 = DObject::IsKindOf((DObject *)ent,AActor::RegistrationInfo.MyClass);
    }
    if (local_87 != false) {
      if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
        bVar3 = false;
        if ((param[1].field_0.field_3.Type == '\x03') &&
           (bVar3 = true, param[1].field_0.field_1.atag != 1)) {
          bVar3 = param[1].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar3) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                        ,0x10c,
                        "int AF_A_KoraxCommand(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        this = (DObject *)param[1].field_0.field_1.a;
        local_8a = true;
        if (this != (DObject *)0x0) {
          local_8a = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
        }
        if (local_8a == false) {
          __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                        ,0x10c,
                        "int AF_A_KoraxCommand(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      if ((numparam < 3) || (param[2].field_0.field_3.Type == 0xff)) {
        ang.Degrees = 0.0;
      }
      else {
        bVar3 = false;
        if ((param[2].field_0.field_3.Type == '\x03') &&
           (bVar3 = true, param[2].field_0.field_1.atag != 8)) {
          bVar3 = param[2].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar3) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                        ,0x10c,
                        "int AF_A_KoraxCommand(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        ang.Degrees = (double)param[2].field_0.field_1.a;
      }
      TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffffb0);
      FSoundID::FSoundID(&local_58,"KoraxCommand");
      S_Sound(ent,2,&local_58,1.0,1.0);
      TAngle<double>::operator-((TAngle<double> *)&pos.Z,90.0);
      TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffffb0,(TAngle<double> *)&pos.Z)
      ;
      TAngle<double>::TAngle(&local_80,(TAngle<double> *)&stack0xffffffffffffffb0);
      AActor::Vec3Angle((DVector3 *)local_78,ent,27.0,&local_80,120.0,false);
      FName::FName(&local_84,"KoraxBolt");
      Spawn(&local_84,(DVector3 *)local_78,ALLOW_REPLACE);
      iVar2 = ent->health;
      iVar1 = AActor::SpawnHealth(ent);
      if (iVar1 >> 1 < iVar2) {
        local_54 = 4;
      }
      else {
        local_54 = 5;
      }
      iVar2 = FRandom::operator()(&pr_koraxcommand);
      P_StartScript(ent,(line_t *)0x0,iVar2 % local_54 + 0xfa,(char *)0x0,(int *)0x0,0,0);
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                  ,0x10c,"int AF_A_KoraxCommand(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                ,0x10c,"int AF_A_KoraxCommand(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_KoraxCommand)
{
	PARAM_ACTION_PROLOGUE;
	DAngle ang;
	int numcommands;

	S_Sound (self, CHAN_VOICE, "KoraxCommand", 1, ATTN_NORM);

	// Shoot stream of lightning to ceiling
	ang = self->Angles.Yaw - 90;
	DVector3 pos = self->Vec3Angle(KORAX_COMMAND_OFFSET, ang, KORAX_COMMAND_HEIGHT);
	Spawn("KoraxBolt", pos, ALLOW_REPLACE);

	if (self->health <= (self->SpawnHealth() >> 1))
	{
		numcommands = 5;
	}
	else
	{
		numcommands = 4;
	}

	P_StartScript (self, NULL, 250+(pr_koraxcommand()%numcommands), NULL, NULL, 0, 0);
	return 0;
}